

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O3

bool __thiscall DepsLog::Recompact(DepsLog *this,string *path,string *err)

{
  pointer pcVar1;
  pointer ppNVar2;
  Deps *pDVar3;
  char *pcVar4;
  pointer ppDVar5;
  pointer ppNVar6;
  pointer ppDVar7;
  Metrics *this_00;
  bool bVar8;
  int iVar9;
  pointer ppNVar10;
  pointer ppDVar11;
  int *piVar12;
  char *__s;
  Metric *pMVar13;
  long lVar14;
  DepsLog *this_01;
  string temp_path;
  ScopedMetric metrics_h_scoped;
  string local_c0;
  undefined1 local_a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  pointer local_70;
  pointer ppNStack_68;
  pointer local_60;
  pointer ppDStack_58;
  pointer local_50;
  pointer ppDStack_48;
  ScopedMetric local_40;
  
  if (Recompact(std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric == '\0') {
    iVar9 = __cxa_guard_acquire(&Recompact(std::__cxx11::string_const&,std::__cxx11::string*)::
                                 metrics_h_metric);
    this_00 = g_metrics;
    if (iVar9 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar13 = (Metric *)0x0;
      }
      else {
        local_a0._0_8_ = local_a0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a0,".ninja_deps recompact","");
        pMVar13 = Metrics::NewMetric(this_00,(string *)local_a0);
        if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
          operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
        }
      }
      Recompact::metrics_h_metric = pMVar13;
      __cxa_guard_release(&Recompact(std::__cxx11::string_const&,std::__cxx11::string*)::
                           metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric(&local_40,Recompact::metrics_h_metric);
  Close(this);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + path->_M_string_length);
  std::__cxx11::string::append((char *)&local_c0);
  unlink(local_c0._M_dataplus._M_p);
  local_a0._16_8_ = &local_80;
  local_a0._0_8_ = local_a0._0_8_ & 0xffffffffffffff00;
  local_a0._8_8_ = (FILE *)0x0;
  local_a0._24_8_ = 0;
  local_80._M_local_buf[0] = '\0';
  local_70 = (pointer)0x0;
  ppNStack_68 = (pointer)0x0;
  local_60 = (pointer)0x0;
  ppDStack_58 = (pointer)0x0;
  local_50 = (pointer)0x0;
  ppDStack_48 = (pointer)0x0;
  this_01 = (DepsLog *)local_a0;
  bVar8 = OpenForWrite(this_01,&local_c0,err);
  if (bVar8) {
    ppNVar2 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppNVar10 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppNVar10 != ppNVar2; ppNVar10 = ppNVar10 + 1)
    {
      (*ppNVar10)->id_ = -1;
    }
    ppDVar11 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->deps_).
                                super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar11) >> 3))
    {
      lVar14 = 0;
      do {
        pDVar3 = ppDVar11[lVar14];
        if (pDVar3 != (Deps *)0x0) {
          bVar8 = IsDepsEntryLiveFor(this_01,(this->nodes_).
                                             super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                             _M_impl.super__Vector_impl_data._M_start[lVar14]);
          if (bVar8) {
            this_01 = (DepsLog *)local_a0;
            bVar8 = RecordDeps((DepsLog *)local_a0,
                               (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar14],pDVar3->mtime,
                               pDVar3->node_count,pDVar3->nodes);
            if (!bVar8) {
              Close((DepsLog *)local_a0);
              goto LAB_00184811;
            }
          }
        }
        lVar14 = lVar14 + 1;
        ppDVar11 = (this->deps_).
                   super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
      } while (lVar14 < (int)((ulong)((long)(this->deps_).
                                            super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppDVar11) >> 3));
    }
    Close((DepsLog *)local_a0);
    ppDVar11 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    ppDVar5 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = local_50;
    (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppDStack_48;
    ppNVar10 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppNVar2 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = local_70;
    (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNStack_68;
    ppNVar6 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    ppDVar7 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_60;
    (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = ppDStack_58;
    local_70 = ppNVar10;
    ppNStack_68 = ppNVar2;
    local_60 = ppNVar6;
    ppDStack_58 = ppDVar7;
    local_50 = ppDVar11;
    ppDStack_48 = ppDVar5;
    iVar9 = unlink((path->_M_dataplus)._M_p);
    if (-1 < iVar9) {
      iVar9 = rename(local_c0._M_dataplus._M_p,(path->_M_dataplus)._M_p);
      bVar8 = true;
      if (-1 < iVar9) goto LAB_00184814;
    }
    piVar12 = __errno_location();
    __s = strerror(*piVar12);
    pcVar4 = (char *)err->_M_string_length;
    strlen(__s);
    bVar8 = false;
    std::__cxx11::string::_M_replace((ulong)err,0,pcVar4,(ulong)__s);
  }
  else {
LAB_00184811:
    bVar8 = false;
  }
LAB_00184814:
  ~DepsLog((DepsLog *)local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  ScopedMetric::~ScopedMetric(&local_40);
  return bVar8;
}

Assistant:

bool DepsLog::Recompact(const string& path, string* err) {
  METRIC_RECORD(".ninja_deps recompact");

  Close();
  string temp_path = path + ".recompact";

  // OpenForWrite() opens for append.  Make sure it's not appending to a
  // left-over file from a previous recompaction attempt that crashed somehow.
  unlink(temp_path.c_str());

  DepsLog new_log;
  if (!new_log.OpenForWrite(temp_path, err))
    return false;

  // Clear all known ids so that new ones can be reassigned.  The new indices
  // will refer to the ordering in new_log, not in the current log.
  for (vector<Node*>::iterator i = nodes_.begin(); i != nodes_.end(); ++i)
    (*i)->set_id(-1);

  // Write out all deps again.
  for (int old_id = 0; old_id < (int)deps_.size(); ++old_id) {
    Deps* deps = deps_[old_id];
    if (!deps) continue;  // If nodes_[old_id] is a leaf, it has no deps.

    if (!IsDepsEntryLiveFor(nodes_[old_id]))
      continue;

    if (!new_log.RecordDeps(nodes_[old_id], deps->mtime,
                            deps->node_count, deps->nodes)) {
      new_log.Close();
      return false;
    }
  }

  new_log.Close();

  // All nodes now have ids that refer to new_log, so steal its data.
  deps_.swap(new_log.deps_);
  nodes_.swap(new_log.nodes_);

  if (unlink(path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  if (rename(temp_path.c_str(), path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  return true;
}